

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsClippedEx(ImRect *bb,ImGuiID *id,bool clip_even_when_logged)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  
  pIVar1 = GImGui;
  bVar2 = ImRect::Overlaps(bb,&GImGui->CurrentWindow->ClipRect);
  if (((bVar2) || ((id != (ImGuiID *)0x0 && (*id == GImGui->ActiveId)))) ||
     ((bVar2 = true, !clip_even_when_logged && (pIVar1->LogEnabled == true)))) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::IsClippedEx(const ImRect& bb, const ImGuiID* id, bool clip_even_when_logged)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindowRead();

    if (!bb.Overlaps(window->ClipRect))
        if (!id || *id != GImGui->ActiveId)
            if (clip_even_when_logged || !g.LogEnabled)
                return true;
    return false;
}